

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool CoreML::hasWeightOfType(Model *model,WeightParamType *wt)

{
  uint32 uVar1;
  SupportVectorClassifier *pSVar2;
  bool bVar3;
  Type *layer;
  int index;
  
  uVar1 = model->_oneof_case_[0];
  if (((uVar1 == 0x12f) || (uVar1 == 500)) || (uVar1 == 0x193)) {
    pSVar2 = (model->Type_).supportvectorclassifier_;
    index = 0;
    if (0 < *(int *)&(pSVar2->numberofsupportvectorsperclass_).rep_) {
      do {
        layer = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          ((RepeatedPtrFieldBase *)&pSVar2->numberofsupportvectorsperclass_,index);
        bVar3 = hasWeightOfType(layer,wt);
        if (bVar3) {
          return bVar3;
        }
        index = index + 1;
      } while (index < *(int *)&(pSVar2->numberofsupportvectorsperclass_).rep_);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool CoreML::hasWeightOfType(const Specification::Model& model, const WeightParamType& wt) {
    auto layers = getNNSpec(model);
    if(layers) {
        for(int i =0; i< layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            if(hasWeightOfType(layer,wt)) {
                return true;
            }
        }
    }
    return false;
}